

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O0

promote<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>_>
* ising::free_energy::square::
  finite_count<unsigned_int,double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,0ul>>
            (uint Lx,uint Ly,double Jx,double Jy,fvar<double,_2UL> beta,
            fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL> h)

{
  invalid_argument *piVar1;
  size_t sVar2;
  reference pvVar3;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> *cr;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> *this;
  int in_EDX;
  int in_ESI;
  promote<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>_>
  *in_RDI;
  value_type in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  int_t s;
  real_t mag;
  real_t cj;
  real_t ci;
  int_t b;
  real_t energy;
  int_t c;
  value_t Z;
  int_t num_states;
  real_t gs_energy;
  vector<double,_std::allocator<double>_> J;
  graph graph;
  unitcell unitcell;
  basis basis;
  graph *in_stack_fffffffffffffba8;
  graph *in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb8;
  uint in_stack_fffffffffffffbbc;
  allocator_type *in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL>
  *in_stack_fffffffffffffbd0;
  double in_stack_fffffffffffffbf0;
  vector<double,_std::allocator<double>_> *this_00;
  double in_stack_fffffffffffffbf8;
  size_t in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc10;
  int tp;
  coordinate_t *in_stack_fffffffffffffc18;
  unitcell *this_01;
  int tp_00;
  offset_t *os;
  size_t in_stack_fffffffffffffc50;
  fvar<double,_2UL> *in_stack_fffffffffffffc58;
  unitcell *in_stack_fffffffffffffc60;
  boundary_t in_stack_fffffffffffffca4;
  span_t *in_stack_fffffffffffffca8;
  unitcell *in_stack_fffffffffffffcb0;
  basis *in_stack_fffffffffffffcb8;
  graph *in_stack_fffffffffffffcc0;
  uint local_1bc;
  uint local_19c;
  uint local_190;
  vector<double,_std::allocator<double>_> local_128 [11];
  value_type local_18;
  value_type local_10;
  
  tp = (int)((ulong)in_stack_fffffffffffffc10 >> 0x20);
  tp_00 = (int)((ulong)&stack0x00000020 >> 0x20);
  os = (offset_t *)&stack0x00000008;
  local_18 = (value_type)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  if ((in_ESI != 0) && (in_EDX != 0)) {
    this_01 = (unitcell *)0x2;
    local_10 = in_XMM0_Qa;
    lattice::basis::simple(in_stack_fffffffffffffc08);
    lattice::unitcell::unitcell
              ((unitcell *)in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8);
    lattice::coordinate(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    lattice::unitcell::add_site(this_01,in_stack_fffffffffffffc18,tp);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x10cc28);
    lattice::offset((long)in_stack_fffffffffffffbf8,(long)in_stack_fffffffffffffbf0);
    lattice::unitcell::add_bond
              (in_stack_fffffffffffffc60,(size_t)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50
               ,os,tp_00);
    Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<long,__1,_1,_0,__1,_1> *)0x10cc6d);
    lattice::offset((long)in_stack_fffffffffffffbf8,(long)in_stack_fffffffffffffbf0);
    lattice::unitcell::add_bond
              (in_stack_fffffffffffffc60,(size_t)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50
               ,os,tp_00);
    Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<long,__1,_1,_0,__1,_1> *)0x10ccb6);
    lattice::extent((size_t)in_stack_fffffffffffffbf8,(size_t)in_stack_fffffffffffffbf0);
    lattice::graph::graph
              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
               in_stack_fffffffffffffca8,in_stack_fffffffffffffca4);
    Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<long,__1,__1,_0,__1,__1> *)0x10cd11);
    sVar2 = lattice::graph::num_sites((graph *)0x10cd1e);
    if (0x1f < sVar2) {
      piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar1,"too large system size");
      __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::allocator<double>::allocator((allocator<double> *)0x10ce8c);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbd0,
               CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
               in_stack_fffffffffffffbc0);
    std::allocator<double>::~allocator((allocator<double> *)0x10ceb2);
    this_00 = local_128;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_00,0);
    *pvVar3 = local_10;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_00,1);
    *pvVar3 = local_18;
    sVar2 = lattice::graph::num_sites((graph *)0x10cf5a);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL>::fvar<int>
              (in_stack_fffffffffffffbd0,
               (int *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    for (local_190 = 0; local_190 < (uint)(1 << ((byte)sVar2 & 0x1f)); local_190 = local_190 + 1) {
      local_19c = 0;
      while( true ) {
        cr = (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> *)
             (ulong)local_19c;
        this = (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> *)
               lattice::graph::num_bonds((graph *)0x10cfe7);
        if (this <= cr) break;
        in_stack_fffffffffffffbd0 =
             (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> *)
             lattice::graph::source(in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8);
        in_stack_fffffffffffffbbc = local_190;
        in_stack_fffffffffffffbc0 =
             (allocator_type *)
             lattice::graph::target(in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8);
        in_stack_fffffffffffffbb8 =
             lattice::graph::bond_type(in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8);
        std::vector<double,_std::allocator<double>_>::operator[]
                  (local_128,(long)in_stack_fffffffffffffbb8);
        local_19c = local_19c + 1;
      }
      local_1bc = 0;
      while( true ) {
        in_stack_fffffffffffffba8 = (graph *)(ulong)local_1bc;
        in_stack_fffffffffffffbb0 = (graph *)lattice::graph::num_sites((graph *)0x10d1b7);
        if (in_stack_fffffffffffffbb0 <= in_stack_fffffffffffffba8) break;
        local_1bc = local_1bc + 1;
      }
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>::operator*
                ((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL> *)
                 in_stack_fffffffffffffbb0,(root_type *)in_stack_fffffffffffffba8);
      boost::math::differentiation::autodiff_v1::detail::operator-
                ((root_type *)in_stack_fffffffffffffbc0,
                 (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL> *)
                 CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,0ul>::operator*
                ((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL> *)
                 in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      boost::math::differentiation::autodiff_v1::detail::
      exp<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>
                (in_stack_fffffffffffffbd0);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>::operator+=
                (this,cr);
    }
    boost::math::differentiation::autodiff_v1::detail::
    log<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>
              ((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> *)
               this_01);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL>::operator-
              ((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> *)
               in_stack_fffffffffffffbb0);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>::operator/
              ((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> *)
               in_stack_fffffffffffffcc0,(fvar<double,_2UL> *)in_stack_fffffffffffffcb8);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL>::operator+
              ((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> *)
               in_stack_fffffffffffffbc0,
               (root_type *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL>::operator/
              ((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> *)
               in_stack_fffffffffffffbc0,
               (root_type *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0);
    lattice::graph::~graph(in_stack_fffffffffffffbb0);
    lattice::unitcell::~unitcell((unitcell *)in_stack_fffffffffffffbb0);
    lattice::basis::~basis((basis *)0x10d3bc);
    return in_RDI;
  }
  piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar1,"Lx and Ly should be positive");
  __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline boost::math::differentiation::promote<U, W> finite_count(I Lx, I Ly,
                                                                T Jx, T Jy,
                                                                U beta, W h) {
  typedef I int_t;
  typedef T real_t;
  typedef boost::math::differentiation::promote<U, W> value_t;
  if (Lx <= 0 || Ly <= 0)
    throw(std::invalid_argument("Lx and Ly should be positive"));

  auto basis = lattice::basis::simple(2);
  auto unitcell = lattice::unitcell(2);
  unitcell.add_site(lattice::coordinate(0, 0), 0);
  unitcell.add_bond(0, 0, lattice::offset(1, 0), 0);
  unitcell.add_bond(0, 0, lattice::offset(0, 1), 1);
  auto graph = lattice::graph(basis, unitcell, lattice::extent(Lx, Ly));
  if (graph.num_sites() >= 32)
    throw(std::invalid_argument("too large system size"));

  std::vector<real_t> J(2);
  J[0] = Jx;
  J[1] = Jy;
  real_t gs_energy = -(Jx + Jy) * (Lx * Ly);
  int_t num_states = 1 << graph.num_sites();
  value_t Z(0);
  for (int_t c = 0; c < num_states; ++c) {
    real_t energy = 0;
    for (int_t b = 0; b < graph.num_bonds(); ++b) {
      real_t ci = real_t(2) * ((c >> graph.source(b)) & 1) - 1;
      real_t cj = real_t(2) * ((c >> graph.target(b)) & 1) - 1;
      energy -= J[graph.bond_type(b)] * ci * cj;
    }
    real_t mag = 0;
    for (int_t s = 0; s < graph.num_sites(); ++s) {
      mag += real_t(2) * ((c >> s) & 1) - 1;
    }
    Z += exp((gs_energy - energy - h * mag) * beta);
  }
  return (-log(Z) / beta + gs_energy) / (Lx * Ly);
}